

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int file_read_publickey(LIBSSH2_SESSION *session,uchar **method,size_t *method_len,
                       uchar **pubkeydata,size_t *pubkeydata_len,char *pubkeyfile)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  bool bVar4;
  size_t local_98;
  size_t local_88;
  size_t tmp_len;
  size_t sp_len;
  size_t pubkey_len;
  uchar *tmp;
  uchar *sp2;
  uchar *sp1;
  uchar *pubkey;
  FILE *pFStack_48;
  char c;
  FILE *fd;
  char *pubkeyfile_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  sp1 = (uchar *)0x0;
  sp_len = 0;
  fd = (FILE *)pubkeyfile;
  pubkeyfile_local = (char *)pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = (uchar **)session;
  pFStack_48 = fopen(pubkeyfile,"r");
  if (pFStack_48 == (FILE *)0x0) {
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Unable to open public key file");
  }
  else {
    while( true ) {
      iVar1 = feof(pFStack_48);
      bVar4 = false;
      if (iVar1 == 0) {
        sVar2 = fread((void *)((long)&pubkey + 7),1,1,pFStack_48);
        bVar4 = false;
        if ((sVar2 == 1) && (bVar4 = false, pubkey._7_1_ != '\r')) {
          bVar4 = pubkey._7_1_ != '\n';
        }
      }
      if (!bVar4) break;
      sp_len = sp_len + 1;
    }
    fseek(pFStack_48,0,0);
    if (sp_len < 2) {
      fclose(pFStack_48);
      session_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Invalid data in public key file");
    }
    else {
      sp1 = (uchar *)(*(code *)method_local[1])(sp_len,method_local);
      if (sp1 == (uchar *)0x0) {
        fclose(pFStack_48);
        session_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)method_local,-6,
                            "Unable to allocate memory for public key data");
      }
      else {
        sVar2 = fread(sp1,1,sp_len,pFStack_48);
        if (sVar2 == sp_len) {
          fclose(pFStack_48);
          while( true ) {
            bVar4 = false;
            if (sp_len != 0) {
              ppuVar3 = __ctype_b_loc();
              bVar4 = ((*ppuVar3)[(int)(uint)sp1[sp_len - 1]] & 0x2000) != 0;
            }
            if (!bVar4) break;
            sp_len = sp_len - 1;
          }
          if (sp_len == 0) {
            (*(code *)method_local[3])(sp1,method_local);
            session_local._4_4_ =
                 _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Missing public key data");
          }
          else {
            sp2 = (uchar *)memchr(sp1,0x20,sp_len);
            if (sp2 == (uchar *)0x0) {
              (*(code *)method_local[3])(sp1,method_local);
              session_local._4_4_ =
                   _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Invalid public key data");
            }
            else {
              sp2 = sp2 + 1;
              if (sp1 < sp2) {
                local_98 = (long)sp2 - (long)sp1;
              }
              else {
                local_98 = 0;
              }
              tmp_len = local_98;
              tmp = (uchar *)memchr(sp2,0x20,sp_len - local_98);
              if (tmp == (uchar *)0x0) {
                tmp = sp1 + sp_len;
              }
              iVar1 = _libssh2_base64_decode
                                ((LIBSSH2_SESSION *)method_local,(char **)&pubkey_len,&local_88,
                                 (char *)sp2,(long)tmp - (long)sp2);
              if (iVar1 == 0) {
                *method_len_local = (size_t)sp1;
                *pubkeydata_local = sp2 + (-1 - (long)sp1);
                *pubkeydata_len_local = pubkey_len;
                *(size_t *)pubkeyfile_local = local_88;
                session_local._4_4_ = 0;
              }
              else {
                (*(code *)method_local[3])(sp1,method_local);
                session_local._4_4_ =
                     _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,
                                    "Invalid key data, not base64 encoded");
              }
            }
          }
        }
        else {
          (*(code *)method_local[3])(sp1,method_local);
          fclose(pFStack_48);
          session_local._4_4_ =
               _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,
                              "Unable to read public key from file");
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
file_read_publickey(LIBSSH2_SESSION * session, unsigned char **method,
                    size_t *method_len,
                    unsigned char **pubkeydata,
                    size_t *pubkeydata_len,
                    const char *pubkeyfile)
{
    FILE *fd;
    char c;
    unsigned char *pubkey = NULL, *sp1, *sp2, *tmp;
    size_t pubkey_len = 0, sp_len;
    size_t tmp_len;

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH, "Loading public key file: %s",
                   pubkeyfile));
    /* Read Public Key */
    fd = fopen(pubkeyfile, FOPEN_READTEXT);
    if(!fd) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to open public key file");
    }
    while(!feof(fd) && 1 == fread(&c, 1, 1, fd) && c != '\r' && c != '\n') {
        pubkey_len++;
    }
    fseek(fd, 0L, SEEK_SET);

    if(pubkey_len <= 1) {
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public key file");
    }

    pubkey = LIBSSH2_ALLOC(session, pubkey_len);
    if(!pubkey) {
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for public key data");
    }
    if(fread(pubkey, 1, pubkey_len, fd) != pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to read public key from file");
    }
    fclose(fd);
    /*
     * Remove trailing whitespace
     */
    while(pubkey_len && isspace(pubkey[pubkey_len - 1])) {
        pubkey_len--;
    }

    if(!pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Missing public key data");
    }

    sp1 = memchr(pubkey, ' ', pubkey_len);
    if(!sp1) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid public key data");
    }

    sp1++;

    sp_len = sp1 > pubkey ? (sp1 - pubkey) : 0;
    sp2 = memchr(sp1, ' ', pubkey_len - sp_len);
    if(!sp2) {
        /* Assume that the id string is missing, but that it's okay */
        sp2 = pubkey + pubkey_len;
    }

    if(_libssh2_base64_decode(session, (char **)&tmp, &tmp_len,
                              (const char *)sp1,
                              sp2 - sp1)) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid key data, not base64 encoded");
    }

    /* Wasting some bytes here (okay, more than some), but since it's likely
     * to be freed soon anyway, we'll just avoid the extra free/alloc and call
     * it a wash */
    *method = pubkey;
    *method_len = sp1 - pubkey - 1;

    *pubkeydata = tmp;
    *pubkeydata_len = tmp_len;

    return 0;
}